

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::LdexpCase::compare(LdexpCase *this,void **inputs,void **outputs)

{
  float fVar1;
  Precision PVar2;
  float fVar3;
  pointer pSVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  ostringstream *this_00;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  deUint32 u32;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar4 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar2 = (pSVar4->varType).m_data.basic.precision;
  uVar5 = glu::getDataTypeScalarSize((pSVar4->varType).m_data.basic.type);
  if (0 < (int)uVar5) {
    fVar13 = (float)~(-1 << (0x17 - (&DAT_01c52c6c)[(ulong)PVar2 * 4] & 0x1f));
    uVar15 = 0;
    bVar16 = false;
    do {
      fVar3 = *(float *)((long)*inputs + uVar15 * 4);
      iVar8 = *(int *)((long)inputs[1] + uVar15 * 4);
      if (fVar3 == 0.0 && iVar8 == 0) {
        fVar11 = (float)((uint)fVar3 & 0x80000000);
      }
      else {
        bVar17 = ((uint)fVar3 & 0x7f800000) != 0;
        uVar12 = (uint)fVar3 & 0x7fffff;
        uVar9 = uVar12 + 0x800000;
        iVar6 = ((uint)fVar3 >> 0x17 & 0xff) - 0x7f;
        if (uVar12 != 0 && !bVar17) {
          uVar9 = uVar12;
          iVar6 = -0x7e;
        }
        iVar6 = iVar6 + iVar8;
        uVar10 = 0;
        if (fVar3 != 0.0) {
          uVar10 = uVar9;
        }
        if (NAN(fVar3)) {
          uVar10 = uVar9;
        }
        uVar9 = 0;
        if ((uVar10 != 0 || iVar6 != 0) &&
           ((fVar3 != 0.0 && (uVar12 == 0 || bVar17) || (uVar9 = 0, iVar6 != -0x7e)))) {
          uVar9 = iVar6 * 0x800000 + 0x3f800000;
        }
        fVar11 = (float)(uVar10 & 0x7fffff | (uint)fVar3 & 0x80000000 | uVar9);
      }
      fVar1 = *(float *)((long)*outputs + uVar15 * 4);
      if (((fVar1 == 0.0) && (fVar14 = fVar11, !NAN(fVar1))) ||
         ((fVar11 == 0.0 && (fVar14 = fVar1, !NAN(fVar11))))) {
        fVar14 = ABS(fVar14);
      }
      else {
        fVar14 = (float)((int)fVar11 - (int)fVar1);
        if ((uint)fVar11 < (uint)fVar1) {
          fVar14 = (float)-((int)fVar11 - (int)fVar1);
        }
      }
      if ((uint)fVar13 < (uint)fVar14) {
        iVar6 = ((uint)fVar3 >> 0x17 & 0xff) - 0x7f;
        iVar8 = -0x7e;
        if (((uint)fVar3 & 0x7fffff) == 0) {
          iVar8 = iVar6;
        }
        if (((uint)fVar3 & 0x7f800000) != 0) {
          iVar8 = iVar6;
        }
        this_00 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar7 = (ostream *)std::ostream::operator<<(this_00,(int)uVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = ",4);
        local_34.value = fVar11;
        poVar7 = Functional::operator<<(poVar7,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", (exp = ",9);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") with ULP threshold ",0x15);
        local_40.value = (deUint64)(uint)fVar13;
        poVar7 = tcu::Format::Hex<8UL>::toStream(&local_40,poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", got ULP diff ",0xf);
        local_40.value = (deUint64)(uint)fVar14;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar7);
        return bVar16;
      }
      uVar15 = uVar15 + 1;
      bVar16 = uVar5 <= uVar15;
    } while (uVar15 != uVar5);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const int		in1			= ((const int*)inputs[1])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const float		refOut0		= ldexp(in0, in1);
			const deUint32	ulpDiff		= getUlpDiffIgnoreZeroSign(out0, refOut0);

			const int		inExp		= tcu::Float32(in0).exponent();

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", (exp = " << inExp << ") with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}